

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp-rb.c
# Opt level: O2

void rtp_rb_pop(void)

{
  uint __line;
  char *__assertion;
  
  if (rtp_rb == (rtp_pkt_t *)0x0) {
    __assertion = "rtp_rb != NULL";
    __line = 0x52;
  }
  else {
    if (rtp_rb_end != rtp_rb_start) {
      rtp_rb[rtp_rb_start].length = 0;
      rtp_rb_start = (rtp_rb_start + 1) % rtp_rb_size;
      rtp_rb_cnt = rtp_rb_cnt - 1;
      return;
    }
    __assertion = "rtp_rb_end != rtp_rb_start";
    __line = 0x53;
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp-rb.c"
                ,__line,"void rtp_rb_pop(void)");
}

Assistant:

void rtp_rb_pop(void) {
  assert(rtp_rb != NULL);
  assert(rtp_rb_end != rtp_rb_start);

  rtp_rb[rtp_rb_start].length = 0;
  rtp_rb_start = (rtp_rb_start + 1) % rtp_rb_size;

  rtp_rb_cnt--;
}